

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20240722::debugging_internal::ParseUnqualifiedName(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  ComplexityGuard guard;
  char *pcVar13;
  ParseState copy;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  iVar12 = iVar2 + 1;
  state->recursion_depth = iVar12;
  state->steps = iVar3 + 1;
  if (0x1ffff < iVar3 || 0xff < iVar2) {
    bVar10 = false;
    goto LAB_001060c7;
  }
  bVar10 = ParseOperatorName(state,(int *)0x0);
  if (!bVar10) {
    iVar12 = state->recursion_depth;
    iVar2 = state->steps;
    state->recursion_depth = iVar12 + 1;
    state->steps = iVar2 + 1;
    if (0x1ffff < iVar2 || 0xff < iVar12) {
LAB_00105ffe:
      state->recursion_depth = iVar12;
      bVar10 = ParseSourceName(state);
      if (((bVar10) || (bVar10 = ParseLocalSourceName(state), bVar10)) ||
         (bVar10 = ParseUnnamedTypeName(state), bVar10)) goto LAB_00106029;
      uVar7 = (state->parse_state).mangled_idx;
      uVar8 = (state->parse_state).out_cur_idx;
      uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
      bVar10 = ParseTwoCharToken(state,"DC");
      if ((bVar10) && (bVar10 = ParseSourceName(state), bVar10)) {
        do {
          bVar10 = ParseSourceName(state);
        } while (bVar10);
        bVar11 = ParseOneCharToken(state,'E');
        bVar10 = true;
        if (!bVar11) goto LAB_00106122;
      }
      else {
LAB_00106122:
        pPVar1 = &state->parse_state;
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        bVar10 = ParseOneCharToken(state,'F');
        if (bVar10) {
          MaybeAppend(state,"friend ");
          bVar11 = ParseSourceName(state);
          bVar10 = true;
          if ((bVar11) || (bVar11 = ParseOperatorName(state,(int *)0x0), bVar11)) goto LAB_00106175;
        }
        pPVar1->mangled_idx = uVar7;
        pPVar1->out_cur_idx = uVar8;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        bVar10 = false;
      }
LAB_00106175:
      iVar12 = state->recursion_depth;
      goto LAB_001060c7;
    }
    uVar4 = (state->parse_state).mangled_idx;
    uVar5 = (state->parse_state).out_cur_idx;
    uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar10 = ParseOneCharToken(state,'C');
    if (bVar10) {
      bVar10 = ParseCharClass(state,"1234");
      if (bVar10) {
        pcVar13 = state->out;
        iVar12 = (state->parse_state).prev_name_idx;
        goto LAB_00105fda;
      }
      bVar10 = ParseOneCharToken(state,'I');
      if (((!bVar10) || (bVar10 = ParseCharClass(state,"12"), !bVar10)) ||
         (bVar10 = ParseClassEnumType(state), !bVar10)) goto LAB_00105f94;
    }
    else {
LAB_00105f94:
      pPVar1 = &state->parse_state;
      pPVar1->mangled_idx = uVar4;
      pPVar1->out_cur_idx = uVar5;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
      bVar10 = ParseOneCharToken(state,'D');
      if ((!bVar10) || (bVar10 = ParseCharClass(state,"0124"), !bVar10)) {
        pPVar1->mangled_idx = uVar4;
        pPVar1->out_cur_idx = uVar5;
        *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
        iVar12 = state->recursion_depth + -1;
        goto LAB_00105ffe;
      }
      pcVar13 = state->out;
      iVar12 = (state->parse_state).prev_name_idx;
      MaybeAppend(state,"~");
LAB_00105fda:
      MaybeAppendWithLength
                (state,pcVar13 + iVar12,(ulong)*(ushort *)&(state->parse_state).field_0xc);
    }
    state->recursion_depth = state->recursion_depth + -1;
  }
LAB_00106029:
  iVar12 = state->recursion_depth;
  iVar2 = state->steps;
  state->recursion_depth = iVar12 + 1;
  state->steps = iVar2 + 1;
  if (iVar2 < 0x20000 && iVar12 < 0x100) {
    bVar11 = ParseOneCharToken(state,'B');
    bVar10 = true;
    if (bVar11) {
      pPVar1 = &state->parse_state;
      do {
        iVar12 = pPVar1->mangled_idx;
        iVar2 = pPVar1->out_cur_idx;
        iVar3 = (state->parse_state).prev_name_idx;
        uVar9 = *(undefined4 *)&(state->parse_state).field_0xc;
        MaybeAppend(state,"[abi:");
        bVar11 = ParseSourceName(state);
        if (!bVar11) {
          pPVar1->mangled_idx = iVar12;
          pPVar1->out_cur_idx = iVar2;
          (state->parse_state).prev_name_idx = iVar3;
          *(undefined4 *)&(state->parse_state).field_0xc = uVar9;
          goto LAB_001060bd;
        }
        MaybeAppend(state,"]");
        bVar11 = ParseOneCharToken(state,'B');
      } while (bVar11);
    }
  }
  else {
LAB_001060bd:
    bVar10 = false;
  }
  iVar12 = state->recursion_depth + -1;
  state->recursion_depth = iVar12;
LAB_001060c7:
  state->recursion_depth = iVar12 + -1;
  return bVar10;
}

Assistant:

static bool ParseUnqualifiedName(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseOperatorName(state, nullptr) || ParseCtorDtorName(state) ||
      ParseSourceName(state) || ParseLocalSourceName(state) ||
      ParseUnnamedTypeName(state)) {
    return ParseAbiTags(state);
  }

  // DC <source-name>+ E
  ParseState copy = state->parse_state;
  if (ParseTwoCharToken(state, "DC") && OneOrMore(ParseSourceName, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // F <source-name>
  // F <operator-name>
  if (ParseOneCharToken(state, 'F') && MaybeAppend(state, "friend ") &&
      (ParseSourceName(state) || ParseOperatorName(state, nullptr))) {
    return true;
  }
  state->parse_state = copy;

  return false;
}